

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

void __thiscall
QtMWidgets::TableViewSection::setHighlightCellOnClick(TableViewSection *this,bool on)

{
  TableViewSectionPrivate *pTVar1;
  QForeachContainer<QList<QtMWidgets::TableViewCell_*>_> _container_750;
  QForeachContainer<QList<QtMWidgets::TableViewCell_*>_> local_40;
  
  pTVar1 = (this->d).d;
  if (pTVar1->highlightCellOnClick != on) {
    pTVar1->highlightCellOnClick = on;
    QtPrivate::QForeachContainer<QList<QtMWidgets::TableViewCell_*>_>::QForeachContainer
              (&local_40,&pTVar1->cells);
    for (; local_40.i.i != local_40.e.i; local_40.i.i = local_40.i.i + 1) {
      (((*local_40.i.i)->d).d)->highlightOnClick = on;
    }
    QArrayDataPointer<QtMWidgets::TableViewCell_*>::~QArrayDataPointer
              ((QArrayDataPointer<QtMWidgets::TableViewCell_*> *)&local_40);
  }
  return;
}

Assistant:

void
TableViewSection::setHighlightCellOnClick( bool on )
{
	if( d->highlightCellOnClick != on )
	{
		d->highlightCellOnClick = on;

		foreach( TableViewCell * cell, d->cells )
			cell->setHighlightOnClick( on );
	}
}